

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

bool __thiscall mp::internal::SolverAppOptionParser::ShowUsage(SolverAppOptionParser *this)

{
  pointer pOVar1;
  pointer pOVar2;
  ArgList local_68;
  pointer local_58;
  undefined8 uStack_50;
  char *local_48;
  
  local_58 = (this->solver_->name_)._M_dataplus._M_p;
  local_68.types_ = 10;
  local_68.field_1.values_ = (Value *)&local_58;
  BasicSolver::Print(this->solver_,(CStringRef)0x390713,&local_68);
  local_58 = (pointer)0x0;
  uStack_50 = 0;
  local_68.types_ = 0;
  local_68.field_1.values_ = (Value *)&local_58;
  BasicSolver::Print(this->solver_,(CStringRef)0x390748,&local_68);
  pOVar1 = (this->options_).options_.super__Vector_base<mp::Option,_std::allocator<mp::Option>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pOVar2 = (this->options_).options_.
                super__Vector_base<mp::Option,_std::allocator<mp::Option>_>._M_impl.
                super__Vector_impl_data._M_start; pOVar2 != pOVar1; pOVar2 = pOVar2 + 1) {
    local_58 = (pointer)(ulong)(uint)(int)pOVar2->name;
    local_48 = pOVar2->description;
    local_68.types_ = 0xa7;
    local_68.field_1.values_ = (Value *)&local_58;
    BasicSolver::Print(this->solver_,(CStringRef)0x390753,&local_68);
  }
  return false;
}

Assistant:

bool SolverAppOptionParser::ShowUsage() {
  solver_.Print("usage: {} [options] stub [-AMPL] [<assignment> ...]\n",
                solver_.name());
  solver_.Print("\nOptions:\n");
  for (OptionList::iterator
       i = options_.begin(), end = options_.end(); i != end; ++i) {
    solver_.Print("\t-{}  {}\n", i->name, i->description);
  }
  return false;
}